

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  do {
    switch(*(byte *)&this->field_0 & 0xf) {
    case 4:
    case 0xd:
      return true;
    default:
      return false;
    case 8:
    case 9:
      this = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
              ((long)&this->field_0 + 8);
    }
  } while( true );
}

Assistant:

bool is_object() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                case json_storage_kind::object:
                    return true;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_object();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_object();
                default:
                    return false;
            }
        }